

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Quaternion QuaternionFromVector3ToVector3(Vector3 from,Vector3 to)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Quaternion QVar11;
  
  fVar8 = to.z;
  fVar4 = from.z;
  fVar9 = from.x;
  fVar5 = from.y;
  fVar6 = to.x;
  fVar7 = to.y;
  fVar10 = fVar5 * fVar8 - fVar7 * fVar4;
  fVar2 = fVar4 * fVar6 - fVar8 * fVar9;
  fVar3 = fVar9 * fVar7 - fVar6 * fVar5;
  fVar5 = fVar4 * fVar8 + fVar9 * fVar6 + fVar5 * fVar7 + 1.0;
  fVar9 = SQRT(fVar5 * fVar5 + fVar3 * fVar3 + fVar10 * fVar10 + fVar2 * fVar2);
  uVar1 = -(uint)(fVar9 == 0.0);
  fVar9 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar9));
  QVar11.x = fVar9 * fVar10;
  QVar11.y = fVar9 * fVar2;
  QVar11.w = fVar9 * fVar5;
  QVar11.z = fVar9 * fVar3;
  return QVar11;
}

Assistant:

RMDEF float Vector3DotProduct(Vector3 v1, Vector3 v2)
{
    float result = (v1.x*v2.x + v1.y*v2.y + v1.z*v2.z);
    return result;
}